

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O2

void convolve_2d_sr_hor_6tap_avx2
               (uint8_t *src,int32_t src_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,int32_t subpel_x_q4,int16_t *im_block)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  __m256i *filt;
  __m256i *filt_00;
  __m256i *palVar4;
  uint8_t *puVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i alVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  __m256i filt_256 [3];
  __m256i coeffs_256 [3];
  __m256i r [2];
  longlong local_160 [12];
  undefined8 local_100;
  undefined2 uStack_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 uStack_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 local_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined1 local_c0 [32];
  __m256i local_a0;
  __m256i local_80;
  
  palVar4 = (__m256i *)(src + -2);
  if (w < 5) {
    auVar11 = vpsraw_avx(*(undefined1 (*) [16])
                          (filter_params_x->filter_ptr +
                          (uint)filter_params_x->taps * (subpel_x_q4 & 0xfU)),1);
    auVar1 = vpshufb_avx(auVar11,_DAT_004c1160);
    auVar6 = vpshufb_avx(auVar11,_DAT_004c1170);
    auVar11 = vpshufb_avx(auVar11,_DAT_004c1180);
    if (w == 2) {
      lVar3 = 0;
      auVar14._8_2_ = 2;
      auVar14._0_8_ = 0x2000200020002;
      auVar14._10_2_ = 2;
      auVar14._12_2_ = 2;
      auVar14._14_2_ = 2;
      do {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = (*palVar4)[0];
        auVar15 = vmovhps_avx(auVar15,*(undefined8 *)((long)*palVar4 + (long)src_stride));
        auVar12 = vpshufb_avx(auVar15,ZEXT816(0xa09090802010100));
        auVar13 = vpshufb_avx(auVar15,ZEXT816(0xc0b0b0a04030302));
        auVar2 = vpshufb_avx(auVar15,ZEXT816(0xe0d0d0c06050504));
        auVar15 = vpmaddubsw_avx(auVar12,auVar1);
        auVar12 = vpmaddubsw_avx(auVar13,auVar6);
        auVar15 = vpaddw_avx(auVar15,auVar12);
        auVar12 = vpmaddubsw_avx(auVar2,auVar11);
        auVar12 = vpaddw_avx(auVar12,auVar14);
        auVar15 = vpaddw_avx(auVar15,auVar12);
        auVar15 = vpsraw_avx(auVar15,2);
        *(long *)(im_block + lVar3 * 2) = auVar15._0_8_;
        palVar4 = (__m256i *)((long)*palVar4 + (long)(src_stride * 2));
        lVar3 = lVar3 + 2;
      } while (h != (int)lVar3);
    }
    else if (w == 4) {
      lVar3 = 0;
      auVar12._8_2_ = 2;
      auVar12._0_8_ = 0x2000200020002;
      auVar12._10_2_ = 2;
      auVar12._12_2_ = 2;
      auVar12._14_2_ = 2;
      do {
        auVar13._8_8_ = 0;
        auVar13._0_8_ = (*palVar4)[0];
        auVar14 = vmovhps_avx(auVar13,*(undefined8 *)((long)*palVar4 + (long)src_stride));
        auVar15 = vpshufb_avx(auVar14,ZEXT816(0xa09090802010100));
        auVar13 = vpshufb_avx(auVar14,ZEXT816(0xc0b0b0a04030302));
        auVar2 = vpshufb_avx(auVar14,ZEXT816(0xe0d0d0c06050504));
        auVar14 = vpmaddubsw_avx(auVar15,auVar1);
        auVar15 = vpmaddubsw_avx(auVar13,auVar6);
        auVar14 = vpaddw_avx(auVar14,auVar15);
        auVar15 = vpmaddubsw_avx(auVar2,auVar11);
        auVar15 = vpaddw_avx(auVar15,auVar12);
        auVar14 = vpaddw_avx(auVar14,auVar15);
        auVar14 = vpsraw_avx(auVar14,2);
        *(undefined1 (*) [16])(im_block + lVar3 * 4) = auVar14;
        palVar4 = (__m256i *)((long)*palVar4 + (long)(src_stride * 2));
        lVar3 = lVar3 + 2;
      } while (h != (int)lVar3);
    }
  }
  else {
    local_160[0] = 0x403030202010100;
    local_160[1] = 0x807070606050504;
    local_160[2] = 0x403030202010100;
    local_160[3] = 0x807070606050504;
    local_160[4] = 0x605050404030302;
    local_160[5] = 0xa09090808070706;
    local_160[6] = 0x605050404030302;
    local_160[7] = 0xa09090808070706;
    local_160[8] = 0x807070606050504;
    local_160[9] = 0xc0b0b0a0a090908;
    local_160[10] = 0x807070606050504;
    local_160[0xb] = 0xc0b0b0a0a090908;
    auVar6 = vpsraw_avx(*(undefined1 (*) [16])
                         (filter_params_x->filter_ptr +
                         (uint)filter_params_x->taps * (subpel_x_q4 & 0xfU)),1);
    auVar1 = vpshufb_avx(auVar6,_DAT_004c3340);
    local_100._0_2_ = auVar1._0_2_;
    auVar1 = vpshufb_avx(auVar6,_DAT_004c3350);
    local_e0 = auVar1._0_2_;
    auVar1 = vpshufb_avx(auVar6,_DAT_004c3360);
    local_c0._0_2_ = auVar1._0_2_;
    local_c0._2_2_ = local_c0._0_2_;
    local_c0._4_2_ = local_c0._0_2_;
    local_c0._6_2_ = local_c0._0_2_;
    local_c0._8_2_ = local_c0._0_2_;
    local_c0._10_2_ = local_c0._0_2_;
    local_c0._12_2_ = local_c0._0_2_;
    local_c0._14_2_ = local_c0._0_2_;
    local_c0._16_2_ = local_c0._0_2_;
    local_c0._18_2_ = local_c0._0_2_;
    local_c0._20_2_ = local_c0._0_2_;
    local_c0._22_2_ = local_c0._0_2_;
    local_c0._24_2_ = local_c0._0_2_;
    local_c0._26_2_ = local_c0._0_2_;
    local_c0._28_2_ = local_c0._0_2_;
    local_c0._30_2_ = local_c0._0_2_;
    auVar10 = ZEXT3264(local_c0);
    filt = (__m256i *)(long)src_stride;
    local_100._2_2_ = (undefined2)local_100;
    local_100._4_2_ = (undefined2)local_100;
    local_100._6_2_ = (undefined2)local_100;
    uStack_f8 = (undefined2)local_100;
    uStack_f6 = (undefined2)local_100;
    uStack_f4 = (undefined2)local_100;
    uStack_f2 = (undefined2)local_100;
    uStack_f0 = (undefined2)local_100;
    uStack_ee = (undefined2)local_100;
    uStack_ec = (undefined2)local_100;
    uStack_ea = (undefined2)local_100;
    uStack_e8 = (undefined2)local_100;
    uStack_e6 = (undefined2)local_100;
    uStack_e4 = (undefined2)local_100;
    uStack_e2 = (undefined2)local_100;
    uStack_de = local_e0;
    uStack_dc = local_e0;
    uStack_da = local_e0;
    uStack_d8 = local_e0;
    uStack_d6 = local_e0;
    uStack_d4 = local_e0;
    uStack_d2 = local_e0;
    uStack_d0 = local_e0;
    uStack_ce = local_e0;
    uStack_cc = local_e0;
    uStack_ca = local_e0;
    uStack_c8 = local_e0;
    uStack_c6 = local_e0;
    uStack_c4 = local_e0;
    uStack_c2 = local_e0;
    switch(w << 0x1d | w - 8U >> 3) {
    case 0:
      auVar7._8_2_ = 2;
      auVar7._0_8_ = 0x2000200020002;
      auVar7._10_2_ = 2;
      auVar7._12_2_ = 2;
      auVar7._14_2_ = 2;
      auVar7._16_2_ = 2;
      auVar7._18_2_ = 2;
      auVar7._20_2_ = 2;
      auVar7._22_2_ = 2;
      auVar7._24_2_ = 2;
      auVar7._26_2_ = 2;
      auVar7._28_2_ = 2;
      auVar7._30_2_ = 2;
      auVar8 = auVar7;
      do {
        x_convolve_6tap_8x2_avx2
                  (palVar4,(uint8_t *)filt,(ptrdiff_t)&local_100,(__m256i *)local_160,filt);
        auVar8 = vpaddw_avx2(auVar8,auVar7);
        auVar8 = vpsraw_avx2(auVar8,2);
        *(undefined1 (*) [32])im_block = auVar8;
        palVar4 = (__m256i *)((long)*palVar4 + (long)(src_stride * 2));
        im_block = (int16_t *)((long)im_block + 0x20);
        h = h + -2;
      } while (h != 0);
      break;
    case 1:
      palVar4 = (__m256i *)(src + 6);
      do {
        alVar9 = auVar10._0_32_;
        filt_00 = filt;
        x_convolve_6tap_8x2_avx2
                  ((__m256i *)(palVar4[-1] + 3),(uint8_t *)filt,(ptrdiff_t)&local_100,
                   (__m256i *)local_160,filt);
        local_a0 = alVar9;
        x_convolve_6tap_8x2_avx2
                  (palVar4,(uint8_t *)filt,(ptrdiff_t)&local_100,(__m256i *)local_160,filt_00);
        auVar10 = ZEXT1664(alVar9._0_16_);
        local_80 = alVar9;
        xy_x_round_store_32_avx2(&local_a0,im_block);
        im_block = im_block + 0x20;
        palVar4 = (__m256i *)((long)*palVar4 + (long)(src_stride * 2));
        h = h + -2;
      } while (h != 0);
      break;
    default:
      puVar5 = src + 0x5e;
      do {
        xy_x_6tap_32_avx2(puVar5 + -0x60,(__m256i *)&local_100,(__m256i *)local_160,im_block);
        xy_x_6tap_32_avx2(puVar5 + -0x40,(__m256i *)&local_100,(__m256i *)local_160,im_block + 0x20)
        ;
        xy_x_6tap_32_avx2(puVar5 + -0x20,(__m256i *)&local_100,(__m256i *)local_160,im_block + 0x40)
        ;
        xy_x_6tap_32_avx2(puVar5,(__m256i *)&local_100,(__m256i *)local_160,im_block + 0x60);
        puVar5 = puVar5 + (long)filt;
        im_block = im_block + 0x80;
        h = h + -1;
      } while (h != 0);
      break;
    case 3:
      do {
        xy_x_6tap_32_avx2((uint8_t *)palVar4,(__m256i *)&local_100,(__m256i *)local_160,im_block);
        palVar4 = (__m256i *)((long)*filt + (long)*palVar4);
        im_block = im_block + 0x20;
        h = h + -1;
      } while (h != 0);
      break;
    case 7:
      puVar5 = src + 0x1e;
      do {
        xy_x_6tap_32_avx2(puVar5 + -0x20,(__m256i *)&local_100,(__m256i *)local_160,im_block);
        xy_x_6tap_32_avx2(puVar5,(__m256i *)&local_100,(__m256i *)local_160,im_block + 0x20);
        puVar5 = puVar5 + (long)filt;
        im_block = im_block + 0x40;
        h = h + -1;
      } while (h != 0);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_hor_6tap_avx2(
    const uint8_t *const src, const int32_t src_stride, const int32_t w,
    const int32_t h, const InterpFilterParams *const filter_params_x,
    const int32_t subpel_x_q4, int16_t *const im_block) {
  const uint8_t *src_ptr = src - 2;
  int32_t y = h;
  int16_t *im = im_block;

  if (w <= 4) {
    __m128i coeffs_128[3];

    prepare_half_coeffs_6tap_ssse3(filter_params_x, subpel_x_q4, coeffs_128);
    if (w == 2) {
      do {
        const __m128i r =
            x_convolve_6tap_2x2_ssse3(src_ptr, src_stride, coeffs_128);
        xy_x_round_store_2x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 2;
        y -= 2;
      } while (y);
    } else if (w == 4) {
      do {
        const __m128i r =
            x_convolve_6tap_4x2_ssse3(src_ptr, src_stride, coeffs_128);
        xy_x_round_store_4x2_sse2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 4;
        y -= 2;
      } while (y);
    }
  } else {
    __m256i coeffs_256[3], filt_256[3];

    filt_256[0] = _mm256_loadu_si256((__m256i const *)filt1_global_avx2);
    filt_256[1] = _mm256_loadu_si256((__m256i const *)filt2_global_avx2);
    filt_256[2] = _mm256_loadu_si256((__m256i const *)filt3_global_avx2);

    prepare_half_coeffs_6tap_avx2(filter_params_x, subpel_x_q4, coeffs_256);

    if (w == 8) {
      do {
        const __m256i res =
            x_convolve_6tap_8x2_avx2(src_ptr, src_stride, coeffs_256, filt_256);
        xy_x_round_store_8x2_avx2(res, im);

        src_ptr += 2 * src_stride;
        im += 2 * 8;
        y -= 2;
      } while (y);
    } else if (w == 16) {
      do {
        __m256i r[2];

        x_convolve_6tap_16x2_avx2(src_ptr, src_stride, coeffs_256, filt_256, r);
        xy_x_round_store_32_avx2(r, im);
        src_ptr += 2 * src_stride;
        im += 2 * 16;
        y -= 2;
      } while (y);
    } else if (w == 32) {
      do {
        xy_x_6tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        src_ptr += src_stride;
        im += 32;
      } while (--y);
    } else if (w == 64) {
      do {
        xy_x_6tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        xy_x_6tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
        src_ptr += src_stride;
        im += 64;
      } while (--y);
    } else {
      assert(w == 128);

      do {
        xy_x_6tap_32_avx2(src_ptr, coeffs_256, filt_256, im);
        xy_x_6tap_32_avx2(src_ptr + 32, coeffs_256, filt_256, im + 32);
        xy_x_6tap_32_avx2(src_ptr + 64, coeffs_256, filt_256, im + 64);
        xy_x_6tap_32_avx2(src_ptr + 96, coeffs_256, filt_256, im + 96);
        src_ptr += src_stride;
        im += 128;
      } while (--y);
    }
  }
}